

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

XmlNodePtr __thiscall libcellml::XmlNode::next(XmlNode *this)

{
  void *pvVar1;
  XmlNode *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlNodePtr XVar2;
  undefined1 local_29;
  XmlNode local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pvVar1 = *(void **)(*(long *)*in_RSI + 0x30);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pvVar1 != (void *)0x0) {
    local_28.mPimpl = (XmlNodeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
              (&local_20,(XmlNode **)&local_28,(allocator<libcellml::XmlNode> *)&local_29);
    this->mPimpl = (XmlNodeImpl *)local_28;
    this[1].mPimpl = (XmlNodeImpl *)local_20._M_pi;
    (local_28.mPimpl)->mXmlNodePtr->_private = pvVar1;
    in_RDX._M_pi = extraout_RDX;
  }
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::next() const
{
    xmlNodePtr next = mPimpl->mXmlNodePtr->next;
    XmlNodePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlNode>();
        nextHandle->setXmlNode(next);
    }
    return nextHandle;
}